

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void * __thiscall jpgd::jpeg_decoder::alloc(jpeg_decoder *this,size_t nSize,bool zero)

{
  mem_block **ppmVar1;
  mem_block *pmVar2;
  ulong uVar3;
  mem_block *pmVar4;
  int iVar5;
  ulong __n;
  
  __n = nSize + 3 + (ulong)(nSize == 0) & 0xfffffffffffffffc;
  ppmVar1 = &this->m_pMem_blocks;
  pmVar2 = (mem_block *)ppmVar1;
  do {
    pmVar2 = pmVar2->m_pNext;
    if (pmVar2 == (mem_block *)0x0) {
      uVar3 = __n + 0x7ff & 0xfffffffffffff800;
      iVar5 = 0x7f00;
      if (0x7f00 < uVar3) {
        iVar5 = (int)uVar3;
      }
      pmVar4 = (mem_block *)malloc((long)iVar5 + 0x20);
      if (pmVar4 == (mem_block *)0x0) {
        stop_decoding(this,JPGD_NOTENOUGHMEM);
      }
      pmVar4->m_pNext = *ppmVar1;
      *ppmVar1 = pmVar4;
      pmVar4->m_used_count = __n;
      pmVar4->m_size = (long)iVar5;
      goto LAB_0014ee92;
    }
    uVar3 = pmVar2->m_used_count + __n;
  } while (pmVar2->m_size < uVar3);
  pmVar4 = (mem_block *)(pmVar2->m_data + (pmVar2->m_used_count - 0x18));
  pmVar2->m_used_count = uVar3;
LAB_0014ee92:
  if (zero) {
    memset(pmVar4->m_data,0,__n);
  }
  return pmVar4->m_data;
}

Assistant:

void* jpeg_decoder::alloc(size_t nSize, bool zero)
	{
		nSize = (JPGD_MAX(nSize, 1) + 3) & ~3;
		char* rv = nullptr;
		for (mem_block* b = m_pMem_blocks; b; b = b->m_pNext)
		{
			if ((b->m_used_count + nSize) <= b->m_size)
			{
				rv = b->m_data + b->m_used_count;
				b->m_used_count += nSize;
				break;
			}
		}
		if (!rv)
		{
			int capacity = JPGD_MAX(32768 - 256, (nSize + 2047) & ~2047);
			mem_block* b = (mem_block*)jpgd_malloc(sizeof(mem_block) + capacity);
			if (!b)
			{
				stop_decoding(JPGD_NOTENOUGHMEM);
			}

			b->m_pNext = m_pMem_blocks;
			m_pMem_blocks = b;
			b->m_used_count = nSize;
			b->m_size = capacity;
			rv = b->m_data;
		}
		if (zero) memset(rv, 0, nSize);
		return rv;
	}